

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Init.cpp
# Opt level: O3

optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
__thiscall
Vault::Sys::Init::start
          (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,Init *this,Parameters *parameters)

{
  Client *client;
  Url local_40;
  
  client = *(Client **)this;
  getUrl_abi_cxx11_(&local_40,this);
  HttpConsumer::put(__return_storage_ptr__,client,&local_40,parameters);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40.value_._M_dataplus._M_p != &local_40.value_.field_2) {
    operator_delete(local_40.value_._M_dataplus._M_p,
                    local_40.value_.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::optional<std::string>
Vault::Sys::Init::start(const Parameters &parameters) {
  return HttpConsumer::put(client_, getUrl(), parameters);
}